

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midi2skini.cpp
# Opt level: O3

void printMidiAsSkini(MidiFile *midifile)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  MidiEvent *mfevent;
  int oldticks;
  double curtime;
  double tempo;
  MidiEvent event;
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  MidiEvent local_68;
  
  iVar2 = smf::MidiFile::getTicksPerQuarterNote(midifile);
  local_78 = 120.0;
  local_80 = 0.0;
  iVar3 = smf::MidiFile::getNumEvents(midifile,0);
  if (0 < iVar3) {
    local_70 = (double)iVar2;
    local_88 = 0.0;
    iVar3 = 0;
    iVar2 = 0;
    do {
      mfevent = smf::MidiFile::getEvent(midifile,0,iVar3);
      smf::MidiEvent::MidiEvent(&local_68,mfevent);
      iVar1 = local_68.tick;
      if (iVar3 != 0) {
        local_88 = local_88 + (((double)(local_68.tick - iVar2) * 60.0) / local_78) / local_70;
        local_80 = local_88;
      }
      processEvent(&local_68,&local_78,&local_80);
      smf::MidiEvent::~MidiEvent(&local_68);
      iVar3 = iVar3 + 1;
      iVar4 = smf::MidiFile::getNumEvents(midifile,0);
      iVar2 = iVar1;
    } while (iVar3 < iVar4);
  }
  return;
}

Assistant:

void printMidiAsSkini(MidiFile& midifile) {
   int       tpq      = midifile.getTicksPerQuarterNote();
   int       ticks    = 0;     // absolute ticks of current event
   double    tempo    = 120.0; // time units will be in seconds
   double    curtime  = 0.0;   // current time in seconds
   int       i;

   for (i=0; i<midifile.getNumEvents(0); i++) {
      int oldticks = ticks;
      MidiEvent event = midifile.getEvent(0, i);
      ticks = event.tick;
      if (i>0) {
         curtime += (ticks - oldticks) * 60.0 / tempo / tpq;
      }
      processEvent(event, tempo, curtime);
   }
}